

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::Prepend
          (ON_SimpleArray<ON_SubDEdgePtr> *this,int count,ON_SubDEdgePtr *buffer)

{
  ON_SubDEdgePtr *pOVar1;
  size_t sz;
  long lVar2;
  ON_SubDEdgePtr *local_60;
  ON_SubDEdgePtr *p1;
  ON_SubDEdgePtr *p;
  ON_SubDEdgePtr *p0;
  size_t count1;
  size_t count0;
  void *pvStack_30;
  int newcapacity;
  void *temp;
  size_t sizeof_buffer;
  ON_SubDEdgePtr *buffer_local;
  int count_local;
  ON_SimpleArray<ON_SubDEdgePtr> *this_local;
  
  if ((0 < count) && (buffer != (ON_SubDEdgePtr *)0x0)) {
    sz = (long)count << 3;
    pvStack_30 = (void *)0x0;
    sizeof_buffer = (size_t)buffer;
    if (this->m_capacity < count + this->m_count) {
      count0._4_4_ = NewCapacity(this);
      if (count0._4_4_ < count + this->m_count) {
        count0._4_4_ = count + this->m_count;
      }
      if ((this->m_a <= buffer) && (buffer < this->m_a + this->m_capacity)) {
        pvStack_30 = onmalloc(sz);
        memcpy(pvStack_30,buffer,sz);
        sizeof_buffer = (size_t)pvStack_30;
      }
      Reserve(this,(long)count0._4_4_);
    }
    lVar2 = (long)this->m_count + (long)count;
    pOVar1 = this->m_a;
    local_60 = this->m_a + lVar2;
    p1 = pOVar1 + this->m_count;
    while (pOVar1 < p1) {
      local_60[-1].m_ptr = p1[-1].m_ptr;
      local_60 = local_60 + -1;
      p1 = p1 + -1;
    }
    memcpy(this->m_a,(void *)sizeof_buffer,sz);
    if (pvStack_30 != (void *)0x0) {
      onfree(pvStack_30);
    }
    this->m_count = (int)lVar2;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Prepend( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }

    const size_t count0 = (size_t)m_count;
    const size_t count1 = count0 + ((size_t)count);
    T* p0 = m_a;
    T* p = p0 + count0;
    T* p1 = m_a + count1;
    while (p > p0)
      *(--p1) = *(--p);
    memcpy( (void*)(m_a), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count = (int)count1;
  }
}